

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O2

void __thiscall intel_keym_v1_t::km_hash_t::~km_hash_t(km_hash_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__km_hash_t_00181918;
  std::__cxx11::string::~string((string *)&this->m_hash);
  return;
}

Assistant:

intel_keym_v1_t::km_hash_t::~km_hash_t() {
    _clean_up();
}